

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

bool __thiscall FIX::DataDictionary::isMultipleValueField(DataDictionary *this,int field)

{
  const_iterator cVar1;
  bool bVar2;
  int local_c;
  
  local_c = field;
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_FIX::TYPE::Type>,_std::_Select1st<std::pair<const_int,_FIX::TYPE::Type>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::TYPE::Type>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_FIX::TYPE::Type>,_std::_Select1st<std::pair<const_int,_FIX::TYPE::Type>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::TYPE::Type>_>_>
                  *)(this + 0x1c0),&local_c);
  if (cVar1._M_node == (_Base_ptr)(this + 0x1c8)) {
    bVar2 = false;
  }
  else {
    bVar2 = *(int *)&cVar1._M_node[1].field_0x4 - 8U < 3;
  }
  return bVar2;
}

Assistant:

bool isMultipleValueField(int field) const {
    FieldTypes::const_iterator i = m_fieldTypes.find(field);
    return i != m_fieldTypes.end()
           && (i->second == TYPE::MultipleValueString || i->second == TYPE::MultipleCharValue
               || i->second == TYPE::MultipleStringValue);
  }